

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O2

void __thiscall
spdlog::details::short_level_formatter<spdlog::details::scoped_padder>::format
          (short_level_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  fmt_helper *this_00;
  char *wrapped_size;
  memory_buf_t *dest_00;
  string_view_t view;
  scoped_padder p;
  scoped_padder sStack_48;
  
  this_00 = *(fmt_helper **)(level::short_level_names + (ulong)msg->level * 8);
  wrapped_size = (char *)strlen((char *)this_00);
  dest_00 = dest;
  scoped_padder::scoped_padder
            (&sStack_48,(size_t)wrapped_size,&(this->super_flag_formatter).padinfo_,dest);
  view.size_ = (size_t)dest;
  view.data_ = wrapped_size;
  fmt_helper::append_string_view(this_00,view,dest_00);
  scoped_padder::~scoped_padder(&sStack_48);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        string_view_t level_name{level::to_short_c_str(msg.level)};
        ScopedPadder p(level_name.size(), padinfo_, dest);
        fmt_helper::append_string_view(level_name, dest);
    }